

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

QModelIndex * __thiscall
QListView::indexAt(QModelIndex *__return_storage_ptr__,QListView *this,QPoint *p)

{
  int *piVar1;
  QAbstractItemViewPrivate *this_00;
  QWidgetData *pQVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  int iVar7;
  LayoutDirection LVar8;
  uint extraout_EDX;
  int extraout_var;
  long *plVar9;
  int iVar10;
  long in_FS_OFFSET;
  undefined1 local_98 [16];
  undefined8 local_88;
  uint uStack_80;
  int iStack_7c;
  QAbstractItemModel *local_78;
  QArrayData *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  iVar10 = (p->xp).m_i;
  iVar7 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                 super_QFrame.super_QWidget + 0x2b0))(this);
  iVar7 = iVar7 + iVar10;
  iVar10 = (p->yp).m_i;
  local_44 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                    super_QFrame.super_QWidget + 0x2b8))(this);
  local_44 = local_44 + iVar10;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = iVar7;
  local_40 = iVar7;
  local_3c = local_44;
  if ((this_00->delayedPendingLayout == true) && (this_00->state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(this_00);
    (**(code **)(**(long **)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  LVar8 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  local_88 = QRect::normalized();
  if (LVar8 == RightToLeft) {
    pQVar2 = ((this_00->super_QAbstractScrollAreaPrivate).viewport)->data;
    iVar10 = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
    plVar9 = *(long **)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                        super_QWidgetPrivate;
    if (iVar10 <= (int)plVar9[3]) {
      iVar10 = (int)plVar9[3];
    }
    uStack_80 = (extraout_EDX - (int)local_88) + ~extraout_EDX + iVar10;
    local_88 = (ulong)(~extraout_EDX + iVar10) | local_88 & 0xffffffff00000000;
  }
  else {
    plVar9 = *(long **)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                        super_QWidgetPrivate;
    uStack_80 = extraout_EDX;
  }
  iStack_7c = extraout_var;
  (**(code **)(*plVar9 + 0x38))(&local_68,plVar9,&local_88);
  auVar5._8_8_ = local_98._8_8_;
  auVar5._0_8_ = local_98._0_8_;
  auVar4._8_8_ = local_98._8_8_;
  auVar4._0_8_ = local_98._0_8_;
  auVar3._8_8_ = local_98._8_8_;
  auVar3._0_8_ = local_98._0_8_;
  if (local_58 == (undefined1 *)0x0) {
    local_88._0_4_ = -1;
    local_88._4_4_ = -1;
  }
  else {
    piVar1 = (int *)(puStack_60 + (long)local_58 * 0x18 + -0x18);
    local_88._0_4_ = *piVar1;
    local_88._4_4_ = piVar1[1];
    uStack_80 = piVar1[2];
    iStack_7c = piVar1[3];
    local_78 = *(QAbstractItemModel **)(puStack_60 + (long)local_58 * 0x18 + -8);
    local_98 = auVar3;
    if (((-1 < (int)local_88) && (local_98 = auVar4, -1 < local_88._4_4_)) &&
       (local_98 = auVar5, local_78 != (QAbstractItemModel *)0x0)) {
      local_98 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                        super_QFrame.super_QWidget + 0x1e0))(this,&local_88);
      cVar6 = QRect::contains((QPoint *)local_98,SUB81(p,0));
      if (cVar6 != '\0') {
        (__return_storage_ptr__->m).ptr = local_78;
        __return_storage_ptr__->r = (int)local_88;
        __return_storage_ptr__->c = local_88._4_4_;
        *(uint *)&__return_storage_ptr__->i = uStack_80;
        *(int *)((long)&__return_storage_ptr__->i + 4) = iStack_7c;
        goto LAB_0056b97d;
      }
    }
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
LAB_0056b97d:
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QListView::indexAt(const QPoint &p) const
{
    Q_D(const QListView);
    QRect rect(p.x() + horizontalOffset(), p.y() + verticalOffset(), 1, 1);
    const QList<QModelIndex> intersectVector = d->intersectingSet(rect);
    QModelIndex index = intersectVector.size() > 0
                        ? intersectVector.last() : QModelIndex();
    if (index.isValid() && visualRect(index).contains(p))
        return index;
    return QModelIndex();
}